

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O2

void Abc_NtkTransferPointers(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkAig)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  ulong uVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  int iVar5;
  
  pAVar3 = Abc_AigConst1(pNtk);
  pAVar4 = Abc_AigConst1(pNtkAig);
  (pAVar3->field_6).pCopy = pAVar4;
  for (iVar5 = 0; iVar5 < pNtk->vCis->nSize; iVar5 = iVar5 + 1) {
    pAVar3 = Abc_NtkCi(pNtk,iVar5);
    pAVar4 = Abc_NtkCi(pNtkAig,iVar5);
    (pAVar3->field_6).pCopy = pAVar4;
  }
  for (iVar5 = 0; iVar5 < pNtk->vCos->nSize; iVar5 = iVar5 + 1) {
    pAVar3 = Abc_NtkCo(pNtk,iVar5);
    pAVar4 = Abc_NtkCo(pNtkAig,iVar5);
    (pAVar3->field_6).pCopy = pAVar4;
  }
  for (iVar5 = 0; iVar5 < pNtk->vBoxes->nSize; iVar5 = iVar5 + 1) {
    pAVar3 = Abc_NtkBox(pNtk,iVar5);
    if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) {
      pAVar4 = Abc_NtkBox(pNtkAig,iVar5);
      (pAVar3->field_6).pCopy = pAVar4;
    }
  }
  for (iVar5 = 0; iVar5 < pNtk->vObjs->nSize; iVar5 = iVar5 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,iVar5);
    if (((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) &&
       (aVar1 = pAVar3->field_6, aVar1.pTemp != (void *)0x0)) {
      uVar2 = *(ulong *)(((ulong)aVar1.pTemp & 0xfffffffffffffffe) + 0x48);
      if ((aVar1.iTemp & 1) != uVar2 && uVar2 != 0) {
        pAVar4 = Abc_EdgeToNode(pNtkAig,*(Abc_Edge_t *)((uVar2 & 0xfffffffffffffffe) + 4));
        (pAVar3->field_6).pTemp = (void *)((ulong)((aVar1.iTemp ^ (uint)uVar2) & 1) ^ (ulong)pAVar4)
        ;
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkTransferPointers( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkAig )
{
    Abc_Obj_t * pObj;
    Ivy_Obj_t * pObjIvy, * pObjFraig;
    int i;
    pObj = Abc_AigConst1(pNtk);
    pObj->pCopy = Abc_AigConst1(pNtkAig);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkCi(pNtkAig, i);
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkCo(pNtkAig, i);
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkBox(pNtkAig, i);
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        pObjIvy = (Ivy_Obj_t *)pObj->pCopy;
        if ( pObjIvy == NULL )
            continue;
        pObjFraig = Ivy_ObjEquiv( pObjIvy );
        if ( pObjFraig == NULL )
            continue;
        pObj->pCopy = Abc_EdgeToNode( pNtkAig, Ivy_Regular(pObjFraig)->TravId );
        pObj->pCopy = Abc_ObjNotCond( pObj->pCopy, Ivy_IsComplement(pObjFraig) );
    }
}